

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build.cpp
# Opt level: O0

void Omega_h::build_from_elems2verts
               (Mesh *mesh,CommPtr *comm,Omega_h_Family family,Int edim,LOs *ev2v,
               Read<long> *vert_globals)

{
  CommPtr *pCVar1;
  undefined1 local_98 [80];
  pointer local_48;
  Read<long> *vert_globals_local;
  LOs *ev2v_local;
  Int edim_local;
  Omega_h_Family family_local;
  CommPtr *comm_local;
  Mesh *mesh_local;
  Mesh *local_18;
  Mesh *local_10;
  
  local_48 = (pointer)vert_globals;
  vert_globals_local = (Read<long> *)ev2v;
  ev2v_local._0_4_ = edim;
  ev2v_local._4_4_ = family;
  _edim_local = comm;
  comm_local = (CommPtr *)mesh;
  Mesh::set_comm(mesh,comm);
  Mesh::set_parting((Mesh *)comm_local,OMEGA_H_ELEM_BASED,false);
  Mesh::set_family((Mesh *)comm_local,ev2v_local._4_4_);
  Mesh::set_dim((Mesh *)comm_local,(Int)ev2v_local);
  pCVar1 = comm_local;
  Read<long>::Read((Read<long> *)(local_98 + 0x40),(Read<int> *)vert_globals);
  build_verts_from_globals((Mesh *)pCVar1,(Read<long> *)(local_98 + 0x40));
  Read<long>::~Read((Read<long> *)(local_98 + 0x40));
  pCVar1 = comm_local;
  Read<int>::Read((Read<int> *)(local_98 + 0x20),ev2v);
  Read<long>::Read((Read<long> *)(local_98 + 0x10),(Read<int> *)vert_globals);
  mesh_local = (Mesh *)local_98;
  local_98._0_8_ = (Alloc *)0x0;
  local_98._8_8_ = (element_type *)0x0;
  local_18 = mesh_local;
  local_10 = mesh_local;
  build_ents_from_elems2verts
            ((Mesh *)pCVar1,(LOs *)(local_98 + 0x20),(GOs *)(local_98 + 0x10),(GOs *)local_98);
  Read<long>::~Read((Read<long> *)local_98);
  Read<long>::~Read((Read<long> *)(local_98 + 0x10));
  Read<int>::~Read((Read<int> *)(local_98 + 0x20));
  return;
}

Assistant:

void build_from_elems2verts(Mesh* mesh, CommPtr comm, Omega_h_Family family,
    Int edim, LOs ev2v, Read<GO> vert_globals) {
  mesh->set_comm(comm);
  mesh->set_parting(OMEGA_H_ELEM_BASED);
  mesh->set_family(family);
  mesh->set_dim(edim);
  build_verts_from_globals(mesh, vert_globals);
  build_ents_from_elems2verts(mesh, ev2v, vert_globals);
}